

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_session.c
# Opt level: O1

oonf_layer2_neigh * dlep_session_get_l2_from_neighbor(dlep_local_neighbor *dlep_neigh)

{
  avl_tree *paVar1;
  long lVar2;
  char *pcVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined8 uVar6;
  char *pcVar7;
  oonf_layer2_neigh_key_str nbuf;
  
  pcVar3 = (dlep_neigh->session->l2_listener).name;
  paVar1 = oonf_layer2_get_net_tree();
  lVar2 = avl_find(paVar1,pcVar3);
  if (lVar2 == 0) {
    uVar5 = (ulong)dlep_neigh->session->log_source;
    if (((&log_global_mask)[uVar5] & 1) == 0) {
      return (oonf_layer2_neigh *)0x0;
    }
    pcVar7 = "Could not find l2net %s for new neighbor";
    uVar6 = 1;
    uVar4 = 0x224;
    pcVar3 = (dlep_neigh->session->l2_listener).name;
  }
  else {
    lVar2 = avl_find(lVar2 + -0x710,&dlep_neigh->neigh_key);
    if (lVar2 != 0) {
      return (oonf_layer2_neigh *)(lVar2 + -0x4c0);
    }
    uVar5 = (ulong)dlep_neigh->session->log_source;
    if (((&log_global_mask)[uVar5] & 2) == 0) {
      return (oonf_layer2_neigh *)0x0;
    }
    pcVar3 = oonf_layer2_neigh_key_to_string(&nbuf,&dlep_neigh->neigh_key,true);
    pcVar7 = "Could not find l2neigh for neighbor %s";
    uVar6 = 2;
    uVar4 = 0x22c;
  }
  oonf_log(uVar6,uVar5,"src/generic/dlep/dlep_session.c",uVar4,0,0,pcVar7,pcVar3);
  return (oonf_layer2_neigh *)0x0;
}

Assistant:

struct oonf_layer2_neigh *
dlep_session_get_l2_from_neighbor(struct dlep_local_neighbor *dlep_neigh) {
  struct oonf_layer2_neigh *l2neigh;
  struct oonf_layer2_net *l2net;
#ifdef OONF_LOG_INFO
  union oonf_layer2_neigh_key_str nbuf;
#endif

  l2net = oonf_layer2_net_get(dlep_neigh->session->l2_listener.name);
  if (!l2net) {
    OONF_DEBUG(dlep_neigh->session->log_source, "Could not find l2net %s for new neighbor",
      dlep_neigh->session->l2_listener.name);
    return NULL;
  }

  l2neigh = oonf_layer2_neigh_get_lid(l2net, &dlep_neigh->neigh_key);
  if (!l2neigh) {
    OONF_INFO(dlep_neigh->session->log_source,
      "Could not find l2neigh for neighbor %s",
      oonf_layer2_neigh_key_to_string(&nbuf, &dlep_neigh->neigh_key, true));
    return NULL;
  }
  return l2neigh;
}